

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_nuniformuiv(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  GLint location;
  GLuint program_00;
  GLuint program_01;
  NotSupportedError *this;
  long lVar2;
  GLuint params [4];
  GLsizei bufferSize;
  ProgramSources sources;
  ShaderProgram program;
  string local_258;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    renderCtx = ctx->m_renderCtx;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,
               "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
               ,"");
    getVtxFragVersionSources(&local_258,&local_1f0,(NegativeTestContext *)ctx->m_renderCtx);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
               ,"");
    getVtxFragVersionSources(&local_230,&local_210,(NegativeTestContext *)ctx->m_renderCtx);
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d0,0,0xac);
    local_120._0_8_ = (pointer)0x0;
    local_120[8] = 0;
    local_120._9_7_ = 0;
    local_120[0x10] = 0;
    local_120._17_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d0,&local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c0 + 8),&local_230);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_140);
    lVar2 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(GLsizei)local_230._M_dataplus._M_p) !=
        &local_230.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_230._M_dataplus._M_p._4_4_,(GLsizei)local_230._M_dataplus._M_p)
                      ,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"fUnif_ivec4");
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
    if (location == -1) {
      local_1d0._0_8_ = (pointer)local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"Failed to retrieve uniform location","");
      NegativeTestContext::fail(ctx,(string *)local_1d0);
      if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
        operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
      }
    }
    program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a2e,(GLint *)&local_230);
    local_1d0._0_8_ = (pointer)local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.","");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    glu::CallLogWrapper::glGetnUniformuiv
              (&ctx->super_CallLogWrapper,0xffffffff,location,(GLsizei)local_230._M_dataplus._M_p,
               (GLuint *)&local_258);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    local_1d0._0_8_ = (pointer)local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_OPERATION is generated if program is not a program object.","");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    glu::CallLogWrapper::glGetnUniformuiv
              (&ctx->super_CallLogWrapper,program_00,location,(GLsizei)local_230._M_dataplus._M_p,
               (GLuint *)&local_258);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    local_1d0._0_8_ = (pointer)local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_OPERATION is generated if program has not been successfully linked.","");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    glu::CallLogWrapper::glGetnUniformuiv
              (&ctx->super_CallLogWrapper,program_01,location,(GLsizei)local_230._M_dataplus._M_p,
               (GLuint *)&local_258);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    local_1d0._0_8_ = (pointer)local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    glu::CallLogWrapper::glGetnUniformuiv
              (&ctx->super_CallLogWrapper,local_100.m_program.m_program,-1,
               (GLsizei)local_230._M_dataplus._M_p,(GLuint *)&local_258);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    local_1d0._0_8_ = (pointer)local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    glu::CallLogWrapper::glGetnUniformuiv
              (&ctx->super_CallLogWrapper,local_100.m_program.m_program,location,-1,
               (GLuint *)&local_258);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x2dc);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void get_nuniformuiv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				unif			= ctx.glGetUniformLocation(program.getProgram(), "fUnif_ivec4");
	GLuint				params[4]		= { 0, 0, 0, 0 };
	GLuint				shader;
	GLuint				programEmpty;
	GLsizei				bufferSize;

	ctx.glUseProgram(program.getProgram());

	if (unif == -1)
		ctx.fail("Failed to retrieve uniform location");

	shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	programEmpty = ctx.glCreateProgram();

	ctx.glGetIntegerv(GL_MAX_COMBINED_UNIFORM_BLOCKS, &bufferSize);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetnUniformuiv(-1, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetnUniformuiv(shader, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetnUniformuiv(programEmpty, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object.");
	ctx.glGetnUniformuiv(program.getProgram(), -1, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize.");
	ctx.glGetnUniformuiv(program.getProgram(), unif, -1, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(programEmpty);
}